

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O1

void __thiscall
yactfr::internal::TsdlParser::_addDtAlias(TsdlParser *this,string *name,PseudoDt *pseudoDt)

{
  char *pcVar1;
  TextLocation TStack_38;
  
  pcVar1 = (this->_ss)._at;
  TextLocation::TextLocation
            (&TStack_38,(long)pcVar1 - (long)(this->_ss)._begin,(this->_ss)._nbLines,
             (long)pcVar1 - (long)(this->_ss)._lineBegin);
  _addDtAlias(this,name,pseudoDt,&TStack_38);
  return;
}

Assistant:

void TsdlParser::_addDtAlias(std::string&& name, const PseudoDt& pseudoDt)
{
    this->_addDtAlias(std::move(name), pseudoDt, _ss.loc());
}